

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::
HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,_kj::_::PromiseAndFulfillerAdapter<void>_>_>::
disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,_kj::_::PromiseAndFulfillerAdapter<void>_>_>
            *this,void *pointer)

{
  void *pvVar1;
  
  if (pointer != (void *)0x0) {
    pvVar1 = *(void **)((long)pointer + 400);
    if (*(long *)((long)pvVar1 + 0x10) == 0) {
      operator_delete(pvVar1,0x18);
    }
    else {
      *(undefined8 *)((long)pvVar1 + 0x10) = 0;
    }
    if (*(char *)((long)pointer + 0x18) == '\x01') {
      Exception::~Exception((Exception *)((long)pointer + 0x20));
    }
    operator_delete(pointer,0x198);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }